

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkOptionsCommand.h
# Opt level: O3

cmCommand * __thiscall cmTargetLinkOptionsCommand::Clone(cmTargetLinkOptionsCommand *this)

{
  cmCommand *pcVar1;
  
  pcVar1 = (cmCommand *)operator_new(0x58);
  pcVar1->Makefile = (cmMakefile *)0x0;
  (pcVar1->Error)._M_dataplus._M_p = (pointer)&(pcVar1->Error).field_2;
  (pcVar1->Error)._M_string_length = 0;
  (pcVar1->Error).field_2._M_local_buf[0] = '\0';
  pcVar1[1]._vptr_cmCommand = (_func_int **)&pcVar1[1].Error;
  pcVar1[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar1[1].Error._M_dataplus._M_p = 0;
  pcVar1[1].Error.field_2._M_allocated_capacity = 0;
  pcVar1->_vptr_cmCommand = (_func_int **)&PTR__cmTargetPropCommandBase_005e8358;
  return pcVar1;
}

Assistant:

cmCommand* Clone() override { return new cmTargetLinkOptionsCommand; }